

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_exec(Context *context,IntrinsicResult *partialResult)

{
  char cVar1;
  bool bVar2;
  long *in_RDX;
  double currentTime;
  double timeout;
  Value local_110;
  ValueList data;
  Value local_f0;
  int status;
  String cmd;
  String stdErr;
  String stdOut;
  Value local_90;
  Value local_80;
  List<MiniScript::Value> local_70;
  Value local_60;
  String local_50;
  String local_40;
  String local_30;
  
  currentTime = MiniScript::Machine::RunTime((Machine *)partialResult[0xe].rs);
  if ((*in_RDX == 0) || (*(char *)(*in_RDX + 0x10) == '\x01')) {
    MiniScript::String::String(&local_30,"cmd");
    MiniScript::Context::GetVar((Context *)&data,(String *)partialResult,(LocalOnlyMode)&local_30);
    MiniScript::Value::ToString((Value *)&cmd,(Machine *)&data);
    MiniScript::Value::~Value((Value *)&data);
    MiniScript::String::release(&local_30);
    MiniScript::String::String(&local_40,"timeout");
    MiniScript::Context::GetVar((Context *)&data,(String *)partialResult,(LocalOnlyMode)&local_40);
    cVar1 = (char)data.ls;
    timeout = (double)CONCAT71(data._9_7_,data.isTemp);
    MiniScript::Value::~Value((Value *)&data);
    MiniScript::String::release(&local_40);
    data.ls = (ListStorage<MiniScript::Value> *)0x0;
    data.isTemp = false;
    MiniScript::String::String(&local_50,&cmd);
    if (cVar1 != '\x01') {
      timeout = 0.0;
    }
    bVar2 = MiniScript::BeginExec(&local_50,timeout,currentTime,&data);
    MiniScript::String::release(&local_50);
    if (bVar2) {
      MiniScript::Value::Value(&local_60,&data);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_60,false);
      MiniScript::Value::~Value(&local_60);
    }
    else {
      MiniScript::IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    }
    MiniScript::List<MiniScript::Value>::release(&data);
    MiniScript::String::release(&cmd);
  }
  else {
    MiniScript::IntrinsicResult::Result((IntrinsicResult *)&cmd);
    MiniScript::Value::GetList((Value *)&data);
    MiniScript::Value::~Value((Value *)&cmd);
    stdOut.ss = (StringStorage *)0x0;
    stdOut.isTemp = false;
    stdErr.ss = (StringStorage *)0x0;
    stdErr.isTemp = false;
    status = -1;
    MiniScript::List<MiniScript::Value>::List(&local_70,&data);
    bVar2 = MiniScript::FinishExec(&local_70,currentTime,&stdOut,&stdErr,&status);
    MiniScript::List<MiniScript::Value>::release(&local_70);
    if (bVar2) {
      cmd.ss = (StringStorage *)&PTR__Dictionary_00166240;
      cmd.isTemp = false;
      cmd._9_7_ = 0;
      MiniScript::Value::Value(&local_f0,"output");
      local_110.type = String;
      local_110.noInvoke = false;
      local_110.localOnly = Off;
      local_110.data = (anon_union_8_3_2f476f46_for_data)stdOut.ss;
      if (stdOut.ss == (StringStorage *)0x0) {
        local_110.data = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
      }
      if ((StringStorage *)local_110.data.ref != (StringStorage *)0x0) {
        (local_110.data.ref)->refCount = (local_110.data.ref)->refCount + 1;
      }
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&cmd,
                 &local_f0,&local_110);
      MiniScript::Value::~Value(&local_110);
      MiniScript::Value::~Value(&local_f0);
      MiniScript::Value::Value(&local_f0,"errors");
      local_110.type = String;
      local_110.noInvoke = false;
      local_110.localOnly = Off;
      local_110.data = (anon_union_8_3_2f476f46_for_data)stdErr.ss;
      if (stdErr.ss == (StringStorage *)0x0) {
        local_110.data = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
      }
      if ((StringStorage *)local_110.data.ref != (StringStorage *)0x0) {
        (local_110.data.ref)->refCount = (local_110.data.ref)->refCount + 1;
      }
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&cmd,
                 &local_f0,&local_110);
      MiniScript::Value::~Value(&local_110);
      MiniScript::Value::~Value(&local_f0);
      MiniScript::Value::Value(&local_f0,"status");
      local_110.data.number = (double)status;
      local_110.type = Number;
      local_110.noInvoke = false;
      local_110.localOnly = Off;
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&cmd,
                 &local_f0,&local_110);
      MiniScript::Value::~Value(&local_110);
      MiniScript::Value::~Value(&local_f0);
      MiniScript::Value::Value(&local_80,(ValueDict *)&cmd);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_80,true);
      MiniScript::Value::~Value(&local_80);
      MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
      ~Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&cmd);
    }
    else {
      MiniScript::Value::Value(&local_90,&data);
      MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_90,false);
      MiniScript::Value::~Value(&local_90);
    }
    MiniScript::String::release(&stdErr);
    MiniScript::String::release(&stdOut);
    MiniScript::List<MiniScript::Value>::release(&data);
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exec(Context *context, IntrinsicResult partialResult) {
	double now = context->vm->RunTime();
	if (partialResult.Done()) {
		// This is the initial entry into `exec`.  Fork a subprocess to execute the
		// given command, and return a partial result we can use to check on its progress.
		String cmd = context->GetVar("cmd").ToString();
		double timeout = context->GetVar("timeout").DoubleValue();
		ValueList data;
		if (BeginExec(cmd, timeout, now, &data)) {
			return IntrinsicResult(data, false);
		}
		return IntrinsicResult::Null;
	}
	
	// This is a subsequent entry to intrinsic_exec, where we've already forked
	// the subprocess, and now we're waiting for it to finish.	al time out of the partial result.
	ValueList data = partialResult.Result().GetList();
	String stdOut, stdErr;
	int status = -1;
	if (FinishExec(data, now, &stdOut, &stdErr, &status)) {
		// All done!
		ValueDict result;
		result.SetValue("output", Value(stdOut));
		result.SetValue("errors", Value(stdErr));
		result.SetValue("status", Value(status));
		return IntrinsicResult(result);
	} else {
		// Not done yet.
		return IntrinsicResult(data, false);
	}
}